

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O1

char * lua_pushstring(lua_State *L,char *s)

{
  StkId pSVar1;
  TString *x_;
  TString *pTVar2;
  char **ppcVar3;
  
  if (s == (char *)0x0) {
    *(undefined1 *)((L->top).offset + 8) = 0;
    ppcVar3 = (char **)0x0;
  }
  else {
    pTVar2 = luaS_new(L,s);
    pSVar1 = (L->top).p;
    *(TString **)pSVar1 = pTVar2;
    (pSVar1->val).tt_ = pTVar2->tt | 0x40;
    ppcVar3 = &pTVar2->contents;
    if (pTVar2->shrlen < '\0') {
      ppcVar3 = (char **)*ppcVar3;
    }
  }
  (L->top).p = (StkId)((L->top).offset + 0x10);
  if (L->l_G->GCdebt < 1) {
    luaC_step(L);
  }
  return (char *)ppcVar3;
}

Assistant:

LUA_API const char *lua_pushstring (lua_State *L, const char *s) {
  lua_lock(L);
  if (s == NULL)
    setnilvalue(s2v(L->top.p));
  else {
    TString *ts;
    ts = luaS_new(L, s);
    setsvalue2s(L, L->top.p, ts);
    s = getstr(ts);  /* internal copy's address */
  }
  api_incr_top(L);
  luaC_checkGC(L);
  lua_unlock(L);
  return s;
}